

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

void Gia_ObjSetBufLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 != 0) {
    pObj_00 = Gia_ObjFanin0(pObj);
    iVar1 = Gia_ObjLevel(p,pObj_00);
    Gia_ObjSetLevel(p,pObj,iVar1);
    return;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x240,"void Gia_ObjSetBufLevel(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void         Gia_ObjSetBufLevel( Gia_Man_t * p, Gia_Obj_t * pObj ) { assert( Gia_ObjIsAnd(pObj) ); Gia_ObjSetLevel( p, pObj, Gia_ObjLevel(p,Gia_ObjFanin0(pObj)) );                                                }